

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

uint32_t get_nfc(uint32_t uc,uint32_t uc2)

{
  int iVar1;
  wchar_t m;
  wchar_t b;
  wchar_t t;
  uint32_t uc2_local;
  uint32_t uc_local;
  
  t = L'\0';
  b = L'΢';
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (b < t) {
            return 0;
          }
          iVar1 = (t + b) / 2;
          if (uc <= u_composition_table[iVar1].cp1) break;
          t = iVar1 + L'\x01';
        }
        if (u_composition_table[iVar1].cp1 <= uc) break;
        b = iVar1 + L'\xffffffff';
      }
      if (uc2 <= u_composition_table[iVar1].cp2) break;
      t = iVar1 + L'\x01';
    }
    if (u_composition_table[iVar1].cp2 <= uc2) break;
    b = iVar1 + L'\xffffffff';
  }
  return u_composition_table[iVar1].nfc;
}

Assistant:

static uint32_t
get_nfc(uint32_t uc, uint32_t uc2)
{
	int t, b;

	t = 0;
	b = sizeof(u_composition_table)/sizeof(u_composition_table[0]) -1;
	while (b >= t) {
		int m = (t + b) / 2;
		if (u_composition_table[m].cp1 < uc)
			t = m + 1;
		else if (u_composition_table[m].cp1 > uc)
			b = m - 1;
		else if (u_composition_table[m].cp2 < uc2)
			t = m + 1;
		else if (u_composition_table[m].cp2 > uc2)
			b = m - 1;
		else
			return (u_composition_table[m].nfc);
	}
	return (0);
}